

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void prof_appraise(CHAR_DATA *ch,char *argument)

{
  PC_DATA *pPVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  OBJ_DATA *arg1;
  int iVar5;
  CProficiencies *pCVar6;
  float fVar7;
  float fVar8;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  long *local_298 [2];
  long local_288 [2];
  ulong local_278 [3];
  buffer<char> local_260;
  char local_240 [536];
  
  if ((*argument != '\0') && (arg1 = get_obj_carry(ch,argument,ch), arg1 != (OBJ_DATA *)0x0)) {
    pPVar1 = ch->pcdata;
    uVar2 = CProficiencies::ProfIndexLookup("appraising");
    iVar5 = 0xb;
    if (uVar2 < 0x19) {
      if (pPVar1 == (PC_DATA *)0x0) {
        pCVar6 = &prof_none;
      }
      else {
        pCVar6 = &pPVar1->profs;
      }
      iVar5 = 10 - pCVar6->profs[uVar2];
    }
    iVar4 = number_percent();
    fVar7 = (float)((iVar4 * iVar5) / 0x4b0);
    iVar5 = number_percent();
    fVar8 = (float)arg1->cost;
    if (iVar5 < 0x33) {
      fVar8 = fVar8 - fVar7 * fVar8;
      if (fVar8 <= 0.0) {
        fVar8 = 0.0;
      }
    }
    else {
      fVar8 = fVar7 * fVar8 + fVar8;
    }
    local_278[0] = (ulong)(uint)(int)fVar8;
    local_260.size_ = 0;
    local_260._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_260.capacity_ = 500;
    fmt.size_ = 0x39;
    fmt.data_ = "You estimate the value of $p to be approximately {} gold.";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278;
    args.desc_ = 1;
    local_260.ptr_ = local_240;
    ::fmt::v9::detail::vformat_to<char>(&local_260,fmt,args,(locale_ref)0x0);
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,local_260.ptr_,local_260.ptr_ + local_260.size_);
    if (local_260.ptr_ != local_240) {
      operator_delete(local_260.ptr_,local_260.capacity_);
    }
    act((char *)local_298[0],ch,arg1,(void *)0x0,3);
    pPVar1 = ch->pcdata;
    sVar3 = CProficiencies::ProfIndexLookup("appraising");
    if (pPVar1 == (PC_DATA *)0x0) {
      pCVar6 = &prof_none;
    }
    else {
      pCVar6 = &pPVar1->profs;
    }
    CProficiencies::CheckImprove(pCVar6,(int)sVar3,0x50);
    WAIT_STATE(ch,0xc);
    if (local_298[0] != local_288) {
      operator_delete(local_298[0],local_288[0] + 1);
    }
    return;
  }
  send_to_char("You aren\'t carrying that.\n\r",ch);
  return;
}

Assistant:

void prof_appraise(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	if (argument[0] == '\0' || !(obj = get_obj_carry(ch, argument, ch)))
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	float mcost = (10 - ch->Profs()->GetProf("appraising")) * number_percent() / 1200;
	float tcost = number_percent() > 50
		? obj->cost + (mcost * obj->cost)
		: std::max((float)0, obj->cost - (mcost * obj->cost));

	auto buffer = fmt::format("You estimate the value of $p to be approximately {} gold.", (int)tcost);
	act(buffer.c_str(), ch, obj, 0, TO_CHAR);
	ch->Profs()->CheckImprove("appraising", 80);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}